

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandRemovePo(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint iOutput;
  Abc_Ntk_t *pNtk;
  char *pcVar2;
  uint fRemoveConst0;
  int iVar3;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
  fRemoveConst0 = 1;
  iOutput = 0xffffffff;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"Nzh"), iVar3 = globalUtilOptind, iVar1 == 0x7a) {
      fRemoveConst0 = fRemoveConst0 ^ 1;
    }
    if (iVar1 == -1) {
      if (pNtk == (Abc_Ntk_t *)0x0) {
        pcVar2 = "Empty network.\n";
      }
      else if (pNtk->ntkType == ABC_NTK_STRASH) {
        if ((int)iOutput < 0) {
          pcVar2 = "The output index is not specified.\n";
        }
        else {
          if ((int)iOutput < pNtk->vPos->nSize) {
            Abc_NtkRemovePo(pNtk,iOutput,fRemoveConst0);
            return 0;
          }
          pcVar2 = "The output index is larger than the allowed POs.\n";
        }
      }
      else {
        pcVar2 = "The network is not strashed.\n";
      }
      iVar3 = -1;
      goto LAB_001f85e1;
    }
    if (iVar1 != 0x4e) goto LAB_001f8579;
    if (argc <= globalUtilOptind) break;
    iOutput = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar3 + 1;
    if ((int)iOutput < 0) {
LAB_001f8579:
      iVar3 = -2;
      Abc_Print(-2,"usage: removepo [-N <num>] [-zh]\n");
      Abc_Print(-2,"\t           remove PO with number <num> if it is const0\n");
      Abc_Print(-2,"\t-N <num> : the zero-based index of the PO to remove [default = %d]\n",
                (ulong)iOutput);
      pcVar2 = "const0";
      if (fRemoveConst0 == 0) {
        pcVar2 = "const1";
      }
      Abc_Print(-2,"\t-z       : toggle removing const1 instead of const0 [default = %s]\n",pcVar2);
      pcVar2 = "\t-h       : print the command usage\n";
LAB_001f85e1:
      Abc_Print(iVar3,pcVar2);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
  goto LAB_001f8579;
}

Assistant:

int Abc_CommandRemovePo( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);//, * pNtkRes = NULL;
    int c, iOutput = -1;
    int fRemoveConst0 = 1;
    extern void Abc_NtkRemovePo( Abc_Ntk_t * pNtk, int iOutput, int fRemoveConst0 );

    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Nzh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            iOutput = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( iOutput < 0 )
                goto usage;
            break;
        case 'z':
            fRemoveConst0 ^= 1;
            break;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "The network is not strashed.\n" );
        return 1;
    }
    if ( iOutput < 0 )
    {
        Abc_Print( -1, "The output index is not specified.\n" );
        return 1;
    }
    if ( iOutput >= Abc_NtkPoNum(pNtk) )
    {
        Abc_Print( -1, "The output index is larger than the allowed POs.\n" );
        return 1;
    }

    // get the new network
//    pNtkRes = Abc_NtkDup( pNtk );
//    Abc_NtkRemovePo( pNtkRes, iOutput );
//    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    Abc_NtkRemovePo( pNtk, iOutput, fRemoveConst0 );
    return 0;

usage:
    Abc_Print( -2, "usage: removepo [-N <num>] [-zh]\n" );
    Abc_Print( -2, "\t           remove PO with number <num> if it is const0\n" );
    Abc_Print( -2, "\t-N <num> : the zero-based index of the PO to remove [default = %d]\n", iOutput );
    Abc_Print( -2, "\t-z       : toggle removing const1 instead of const0 [default = %s]\n", fRemoveConst0? "const0": "const1" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}